

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O1

void aom_lpf_horizontal_6_quad_avx2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  uVar1 = *_limit0;
  auVar20[1] = uVar1;
  auVar20[0] = uVar1;
  auVar20[2] = uVar1;
  auVar20[3] = uVar1;
  auVar20[4] = uVar1;
  auVar20[5] = uVar1;
  auVar20[6] = uVar1;
  auVar20[7] = uVar1;
  auVar20[8] = uVar1;
  auVar20[9] = uVar1;
  auVar20[10] = uVar1;
  auVar20[0xb] = uVar1;
  auVar20[0xc] = uVar1;
  auVar20[0xd] = uVar1;
  auVar20[0xe] = uVar1;
  auVar20[0xf] = uVar1;
  uVar1 = *_blimit0;
  auVar22[1] = uVar1;
  auVar22[0] = uVar1;
  auVar22[2] = uVar1;
  auVar22[3] = uVar1;
  auVar22[4] = uVar1;
  auVar22[5] = uVar1;
  auVar22[6] = uVar1;
  auVar22[7] = uVar1;
  auVar22[8] = uVar1;
  auVar22[9] = uVar1;
  auVar22[10] = uVar1;
  auVar22[0xb] = uVar1;
  auVar22[0xc] = uVar1;
  auVar22[0xd] = uVar1;
  auVar22[0xe] = uVar1;
  auVar22[0xf] = uVar1;
  auVar2 = *(undefined1 (*) [16])(s + -(long)(p * 3));
  auVar14._16_16_ = auVar2;
  auVar14._0_16_ = auVar2;
  lVar13 = (long)p;
  auVar3 = *(undefined1 (*) [16])(s + lVar13 * -2);
  auVar19._16_16_ = auVar3;
  auVar19._0_16_ = auVar3;
  auVar4 = *(undefined1 (*) [16])(s + -lVar13);
  auVar27._16_16_ = auVar4;
  auVar27._0_16_ = auVar4;
  auVar5 = *(undefined1 (*) [16])s;
  auVar18._16_16_ = auVar5;
  auVar18._0_16_ = auVar5;
  auVar6 = *(undefined1 (*) [16])(s + lVar13);
  auVar16._16_16_ = auVar6;
  auVar16._0_16_ = auVar6;
  auVar7 = *(undefined1 (*) [16])(s + lVar13 * 2);
  auVar17._16_16_ = auVar7;
  auVar17._0_16_ = auVar7;
  auVar8 = vpsubusb_avx(auVar3,auVar4);
  auVar23 = vpsubusb_avx(auVar4,auVar3);
  auVar8 = vpor_avx(auVar23,auVar8);
  auVar23 = vpsubusb_avx(auVar6,auVar5);
  auVar9 = vpsubusb_avx(auVar5,auVar6);
  auVar23 = vpor_avx(auVar23,auVar9);
  auVar9 = vpmaxub_avx(auVar23,auVar8);
  auVar8 = vpsubusb_avx(auVar4,auVar5);
  auVar23 = vpsubusb_avx(auVar5,auVar4);
  auVar8 = vpor_avx(auVar8,auVar23);
  auVar23 = vpsubusb_avx(auVar3,auVar6);
  auVar25 = vpsubusb_avx(auVar6,auVar3);
  auVar23 = vpor_avx(auVar23,auVar25);
  auVar8 = vpaddusb_avx(auVar8,auVar8);
  auVar25[8] = 0x7f;
  auVar25._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar25[9] = 0x7f;
  auVar25[10] = 0x7f;
  auVar25[0xb] = 0x7f;
  auVar25[0xc] = 0x7f;
  auVar25[0xd] = 0x7f;
  auVar25[0xe] = 0x7f;
  auVar25[0xf] = 0x7f;
  auVar23 = vpsrlw_avx(auVar23,1);
  auVar23 = vpand_avx(auVar23,auVar25);
  auVar8 = vpaddusb_avx(auVar8,auVar23);
  auVar23 = vpminub_avx(auVar8,auVar22);
  auVar23 = vpcmpeqb_avx(auVar8,auVar23);
  auVar8 = vpcmpeqd_avx(auVar8,auVar8);
  auVar8 = vpmaxub_avx(auVar23 ^ auVar8,auVar9);
  auVar23 = vpsubusb_avx(auVar2,auVar3);
  auVar25 = vpsubusb_avx(auVar3,auVar2);
  auVar23 = vpor_avx(auVar23,auVar25);
  auVar25 = vpsubusb_avx(auVar7,auVar6);
  auVar22 = vpsubusb_avx(auVar6,auVar7);
  auVar25 = vpor_avx(auVar25,auVar22);
  auVar23 = vpmaxub_avx(auVar23,auVar25);
  auVar8 = vpmaxub_avx(auVar23,auVar8);
  auVar23 = vpminub_avx(auVar8,auVar20);
  auVar8 = vpcmpeqb_avx(auVar8,auVar23);
  if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar8[0xf] < '\0') {
    uVar1 = *_thresh0;
    auVar23[1] = uVar1;
    auVar23[0] = uVar1;
    auVar23[2] = uVar1;
    auVar23[3] = uVar1;
    auVar23[4] = uVar1;
    auVar23[5] = uVar1;
    auVar23[6] = uVar1;
    auVar23[7] = uVar1;
    auVar23[8] = uVar1;
    auVar23[9] = uVar1;
    auVar23[10] = uVar1;
    auVar23[0xb] = uVar1;
    auVar23[0xc] = uVar1;
    auVar23[0xd] = uVar1;
    auVar23[0xe] = uVar1;
    auVar23[0xf] = uVar1;
    auVar23 = vpminub_avx(auVar9,auVar23);
    auVar21[8] = 0x80;
    auVar21._0_8_ = 0x8080808080808080;
    auVar21[9] = 0x80;
    auVar21[10] = 0x80;
    auVar21[0xb] = 0x80;
    auVar21[0xc] = 0x80;
    auVar21[0xd] = 0x80;
    auVar21[0xe] = 0x80;
    auVar21[0xf] = 0x80;
    auVar20 = vpcmpeqb_avx(auVar9,auVar23);
    auVar23 = vpsubsb_avx(auVar21 ^ auVar3,auVar21 ^ auVar6);
    auVar25 = vpsubsb_avx(auVar21 ^ auVar5,auVar21 ^ auVar4);
    auVar23 = vpandn_avx(auVar20,auVar23);
    auVar23 = vpaddsb_avx(auVar23,auVar25);
    auVar23 = vpaddsb_avx(auVar23,auVar25);
    auVar23 = vpaddsb_avx(auVar23,auVar25);
    auVar25 = vpand_avx(auVar8,auVar23);
    auVar28[8] = 4;
    auVar28._0_8_ = 0x404040404040404;
    auVar28[9] = 4;
    auVar28[10] = 4;
    auVar28[0xb] = 4;
    auVar28[0xc] = 4;
    auVar28[0xd] = 4;
    auVar28[0xe] = 4;
    auVar28[0xf] = 4;
    auVar30[8] = 3;
    auVar30._0_8_ = 0x303030303030303;
    auVar30[9] = 3;
    auVar30[10] = 3;
    auVar30[0xb] = 3;
    auVar30[0xc] = 3;
    auVar30[0xd] = 3;
    auVar30[0xe] = 3;
    auVar30[0xf] = 3;
    auVar23 = vpaddsb_avx(auVar25,auVar28);
    auVar25 = vpaddsb_avx(auVar25,auVar30);
    auVar22 = vpcmpgtb_avx((undefined1  [16])0x0,auVar23);
    auVar23 = vpsrlw_avx(auVar23,3);
    auVar15._8_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar15._0_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar23 = vpand_avx(auVar23,auVar15);
    auVar22 = vpandn_avx(auVar15,auVar22);
    auVar24 = vpor_avx(auVar23,auVar22);
    auVar28 = vpsubsb_avx(auVar21 ^ auVar5,auVar24);
    auVar22 = vpcmpgtb_avx((undefined1  [16])0x0,auVar25);
    auVar23 = vpsrlw_avx(auVar25,3);
    auVar23 = vpand_avx(auVar23,auVar15);
    auVar25 = vpandn_avx(auVar15,auVar22);
    auVar23 = vpor_avx(auVar23,auVar25);
    auVar23 = vpaddsb_avx(auVar21 ^ auVar4,auVar23);
    auVar29[8] = 1;
    auVar29._0_8_ = 0x101010101010101;
    auVar29[9] = 1;
    auVar29[10] = 1;
    auVar29[0xb] = 1;
    auVar29[0xc] = 1;
    auVar29[0xd] = 1;
    auVar29[0xe] = 1;
    auVar29[0xf] = 1;
    auVar25 = vpaddsb_avx(auVar29,auVar24);
    auVar22 = vpsrlw_avx(auVar25,1);
    auVar24._8_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar24._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar22 = vpand_avx(auVar22,auVar24);
    auVar25 = vpandn_avx(auVar24,auVar25);
    auVar25 = vpor_avx(auVar22,auVar25);
    auVar31._8_8_ = 0x8080808080808080;
    auVar31._0_8_ = 0x8080808080808080;
    auVar25 = vpand_avx(auVar20,auVar25);
    auVar3 = vpaddsb_avx(auVar21 ^ auVar3,auVar25);
    auVar6 = vpsubsb_avx(auVar21 ^ auVar6,auVar25);
    auVar25 = vpsubusb_avx(auVar2,auVar4);
    auVar4 = vpsubusb_avx(auVar4,auVar2);
    auVar4 = vpor_avx(auVar25,auVar4);
    auVar25 = vpsubusb_avx(auVar7,auVar5);
    auVar5 = vpsubusb_avx(auVar5,auVar7);
    auVar5 = vpor_avx(auVar5,auVar25);
    auVar4 = vpmaxub_avx(auVar4,auVar5);
    auVar4 = vpmaxub_avx(auVar4,auVar9);
    auVar5 = vpminub_avx(auVar29,auVar4);
    auVar4 = vpcmpeqb_avx(auVar4,auVar5);
    auVar4 = vpand_avx(auVar8,auVar4);
    if ((((((((((((((((auVar4 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar4 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar4 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar4 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar4 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar4 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar4 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar4 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar4 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar4 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar4 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar4 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar4[0xf] < '\0') {
      auVar10 = vpshufb_avx2(auVar14,_DAT_004e0f00);
      auVar11 = vpshufb_avx2(auVar19,_DAT_004e0f00);
      auVar12 = vpshufb_avx2(auVar27,_DAT_004e0f00);
      auVar18 = vpshufb_avx2(auVar18,_DAT_004e0f00);
      auVar14 = vpaddw_avx2(auVar11,auVar10);
      auVar19 = vpaddw_avx2(auVar10,auVar18);
      auVar26._8_2_ = 4;
      auVar26._0_8_ = 0x4000400040004;
      auVar26._10_2_ = 4;
      auVar26._12_2_ = 4;
      auVar26._14_2_ = 4;
      auVar26._16_2_ = 4;
      auVar26._18_2_ = 4;
      auVar26._20_2_ = 4;
      auVar26._22_2_ = 4;
      auVar26._24_2_ = 4;
      auVar26._26_2_ = 4;
      auVar26._28_2_ = 4;
      auVar26._30_2_ = 4;
      auVar19 = vpaddw_avx2(auVar19,auVar26);
      auVar27 = vpaddw_avx2(auVar14,auVar12);
      auVar27 = vpaddw_avx2(auVar27,auVar27);
      auVar19 = vpaddw_avx2(auVar19,auVar27);
      auVar27 = vpsrlw_avx2(auVar19,3);
      auVar5 = vpackuswb_avx(auVar27._0_16_,auVar27._16_16_);
      auVar5 = vpblendvb_avx(auVar31 ^ auVar3,auVar5,auVar4);
      auVar27 = vpshufb_avx2(auVar16,_DAT_004e0f00);
      auVar16 = vpaddw_avx2(auVar10,auVar10);
      auVar16 = vpsubw_avx2(auVar18,auVar16);
      auVar16 = vpaddw_avx2(auVar16,auVar27);
      auVar16 = vpaddw_avx2(auVar19,auVar16);
      auVar19 = vpsrlw_avx2(auVar16,3);
      auVar3 = vpackuswb_avx(auVar19._0_16_,auVar19._16_16_);
      auVar8 = vpblendvb_avx(auVar31 ^ auVar23,auVar3,auVar4);
      auVar19 = vpshufb_avx2(auVar17,_DAT_004e0f00);
      auVar14 = vpsubw_avx2(auVar27,auVar14);
      auVar14 = vpaddw_avx2(auVar14,auVar19);
      auVar14 = vpaddw_avx2(auVar14,auVar16);
      auVar17 = vpsrlw_avx2(auVar14,3);
      auVar3 = vpackuswb_avx(auVar17._0_16_,auVar17._16_16_);
      auVar23 = vpblendvb_avx(auVar28 ^ auVar31,auVar3,auVar4);
      auVar17 = vpaddw_avx2(auVar12,auVar11);
      auVar16 = vpaddw_avx2(auVar19,auVar19);
      auVar17 = vpsubw_avx2(auVar16,auVar17);
      auVar14 = vpaddw_avx2(auVar17,auVar14);
      auVar14 = vpsrlw_avx2(auVar14,3);
      auVar3 = vpackuswb_avx(auVar14._0_16_,auVar14._16_16_);
      auVar3 = vpblendvb_avx(auVar31 ^ auVar6,auVar3,auVar4);
      *(undefined1 (*) [16])(s + -(long)(p * 3)) = auVar2;
      *(undefined1 (*) [16])(s + lVar13 * -2) = auVar5;
      *(undefined1 (*) [16])(s + -lVar13) = auVar8;
      *(undefined1 (*) [16])s = auVar23;
      *(undefined1 (*) [16])(s + lVar13) = auVar3;
      *(undefined1 (*) [16])(s + lVar13 * 2) = auVar7;
      return;
    }
    *(undefined1 (*) [16])(s + lVar13 * -2) = auVar31 ^ auVar3;
    *(undefined1 (*) [16])(s + -lVar13) = auVar31 ^ auVar23;
    *(undefined1 (*) [16])s = auVar28 ^ auVar31;
    *(undefined1 (*) [16])(s + lVar13) = auVar31 ^ auVar6;
  }
  return;
}

Assistant:

void aom_lpf_horizontal_6_quad_avx2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  __m256i p256_2, q256_2, p256_1, q256_1, p256_0, q256_0;
  __m128i p2, p1, p0, q0, q1, q2;
  __m128i mask, flat;

  const __m128i thresh_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_thresh0[0]));
  const __m128i limit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_limit0[0]));
  const __m128i blimit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_blimit0[0]));
  const __m128i zero = _mm_setzero_si128();
  const __m128i ff = _mm_cmpeq_epi8(zero, zero);

  p256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 3 * p)));
  p256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 2 * p)));
  p256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 1 * p)));
  q256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 0 * p)));
  q256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 1 * p)));
  q256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 2 * p)));

  p2 = _mm256_castsi256_si128(p256_2);
  p1 = _mm256_castsi256_si128(p256_1);
  p0 = _mm256_castsi256_si128(p256_0);
  q0 = _mm256_castsi256_si128(q256_0);
  q1 = _mm256_castsi256_si128(q256_1);
  q2 = _mm256_castsi256_si128(q256_2);

  {
    __m128i work;
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i abs_p1p0 =
        _mm_or_si128(_mm_subs_epu8(p1, p0), _mm_subs_epu8(p0, p1));
    const __m128i abs_q1q0 =
        _mm_or_si128(_mm_subs_epu8(q1, q0), _mm_subs_epu8(q0, q1));
    __m128i abs_p0q0 =
        _mm_or_si128(_mm_subs_epu8(p0, q0), _mm_subs_epu8(q0, p0));
    __m128i abs_p1q1 =
        _mm_or_si128(_mm_subs_epu8(p1, q1), _mm_subs_epu8(q1, p1));

    flat = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(flat, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p1), _mm_subs_epu8(p1, p2)),
        _mm_or_si128(_mm_subs_epu8(q2, q1), _mm_subs_epu8(q1, q2)));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // loop filter
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i one = _mm_set1_epi8(1);
    __m128i hev;

    hev = _mm_subs_epu8(flat, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);

    __m128i ps1 = _mm_xor_si128(p1, t80);
    __m128i ps0 = _mm_xor_si128(p0, t80);
    __m128i qs0 = _mm_xor_si128(q0, t80);
    __m128i qs1 = _mm_xor_si128(q1, t80);
    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;
    __m128i flat_p1, flat_p0, flat_q0, flat_q1;

    filt = _mm_and_si128(_mm_subs_epi8(ps1, qs1), hev);
    work_a = _mm_subs_epi8(qs0, ps0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);

    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    qs0 = _mm_xor_si128(_mm_subs_epi8(qs0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    ps0 = _mm_xor_si128(_mm_adds_epi8(ps0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    ps1 = _mm_xor_si128(_mm_adds_epi8(ps1, filt), t80);
    qs1 = _mm_xor_si128(_mm_subs_epi8(qs1, filt), t80);

    __m128i work;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p0), _mm_subs_epu8(p0, p2)),
        _mm_or_si128(_mm_subs_epu8(q2, q0), _mm_subs_epu8(q0, q2)));
    flat = _mm_max_epu8(work, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);

    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m256i four = _mm256_set1_epi16(4);
      __m256i pixetFilter, add, res;

      const __m256i filter =
          _mm256_load_si256((__m256i const *)filt_loopfilter_avx2);

      p256_2 = _mm256_shuffle_epi8(p256_2, filter);
      p256_1 = _mm256_shuffle_epi8(p256_1, filter);
      p256_0 = _mm256_shuffle_epi8(p256_0, filter);
      q256_0 = _mm256_shuffle_epi8(q256_0, filter);
      q256_1 = _mm256_shuffle_epi8(q256_1, filter);
      q256_2 = _mm256_shuffle_epi8(q256_2, filter);

      pixetFilter = _mm256_slli_epi16(
          _mm256_add_epi16(p256_2, _mm256_add_epi16(p256_1, p256_0)), 1);
      pixetFilter =
          _mm256_add_epi16(pixetFilter, _mm256_add_epi16(p256_2, q256_0));
      pixetFilter = _mm256_add_epi16(four, pixetFilter);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_p1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      p1 = _mm_andnot_si128(flat, ps1);
      flat_p1 = _mm_and_si128(flat, flat_p1);
      p1 = _mm_or_si128(flat_p1, p1);

      add = _mm256_add_epi16(_mm256_sub_epi16(q256_1, p256_2),
                             _mm256_sub_epi16(q256_0, p256_2));
      pixetFilter = _mm256_add_epi16(pixetFilter, add);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_p0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      p0 = _mm_andnot_si128(flat, ps0);
      flat_p0 = _mm_and_si128(flat, flat_p0);
      p0 = _mm_or_si128(flat_p0, p0);

      add = _mm256_add_epi16(_mm256_sub_epi16(q256_2, p256_2),
                             _mm256_sub_epi16(q256_1, p256_1));
      pixetFilter = _mm256_add_epi16(pixetFilter, add);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_q0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      q0 = _mm_andnot_si128(flat, qs0);
      flat_q0 = _mm_and_si128(flat, flat_q0);
      q0 = _mm_or_si128(flat_q0, q0);

      add = _mm256_add_epi16(_mm256_sub_epi16(q256_2, p256_1),
                             _mm256_sub_epi16(q256_2, p256_0));
      pixetFilter = _mm256_add_epi16(pixetFilter, add);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_q1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      q1 = _mm_andnot_si128(flat, qs1);
      flat_q1 = _mm_and_si128(flat, flat_q1);
      q1 = _mm_or_si128(flat_q1, q1);

      _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
      _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), q0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
      _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), ps1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), ps0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), qs0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), qs1);
    }
  }
}